

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  stbi__gif *g;
  long lVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  char *local_458;
  int *local_450;
  int *local_448;
  int *local_440;
  stbi__png p;
  
  p.s = s;
  iVar3 = stbi__png_info_raw(&p,x,y,comp);
  if (iVar3 == 0) {
    g = (stbi__gif *)malloc(0x8870);
    iVar3 = 1;
    iVar4 = stbi__gif_header(s,g,comp,1);
    if (iVar4 == 0) {
      local_450 = comp;
      local_448 = y;
      free(g);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar3 = stbi__hdr_test(s);
      if (iVar3 != 0) {
        bVar1 = false;
        local_440 = x;
        while( true ) {
          stbi__hdr_gettoken(s,(char *)&p);
          piVar2 = local_440;
          if ((char)p.s == '\0') break;
          iVar3 = bcmp(&p,"FORMAT=32-bit_rle_rgbe",0x17);
          if (iVar3 == 0) {
            bVar1 = true;
          }
        }
        if (bVar1) {
          stbi__hdr_gettoken(s,(char *)&p);
          iVar3 = bcmp(&p,"-Y ",3);
          if (iVar3 == 0) {
            local_458 = (char *)((long)&p.s + 3);
            lVar5 = strtol(local_458,&local_458,10);
            if (local_448 != (int *)0x0) {
              *local_448 = (int)lVar5;
            }
            local_458 = local_458 + 2;
            do {
              pcVar6 = local_458;
              local_458 = pcVar6 + 1;
            } while (pcVar6[-2] == ' ');
            if (((pcVar6[-2] == '+') && (pcVar6[-1] == 'X')) && (*pcVar6 == ' ')) {
              lVar5 = strtol(local_458,(char **)0x0,10);
              if (piVar2 != (int *)0x0) {
                *piVar2 = (int)lVar5;
              }
              if (local_450 == (int *)0x0) {
                return 1;
              }
              *local_450 = 3;
              return 1;
            }
          }
        }
      }
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      *(char **)(in_FS_OFFSET + -0x10) = "unknown image type";
      iVar3 = 0;
    }
    else {
      if (x != (int *)0x0) {
        *x = g->w;
      }
      if (y != (int *)0x0) {
        *y = g->h;
      }
      free(g);
    }
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}